

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_crypt_cfb8
              (mbedtls_aes_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output)

{
  undefined4 uVar1;
  undefined8 uVar2;
  byte unaff_BL;
  size_t sVar3;
  undefined7 uStack_57;
  undefined1 local_50;
  
  if (length != 0) {
    sVar3 = 0;
    do {
      uStack_57 = (undefined7)((ulong)*(undefined8 *)iv >> 8);
      uVar1 = *(undefined4 *)(iv + 8);
      uVar2 = *(undefined8 *)(iv + 8);
      mbedtls_aes_crypt_ecb(ctx,1,iv,iv);
      if (mode == 0) {
        unaff_BL = input[sVar3];
      }
      if (mode == 1) {
        unaff_BL = input[sVar3] ^ *iv;
      }
      output[sVar3] = input[sVar3] ^ *iv;
      local_50 = (undefined1)uVar1;
      *(undefined8 *)(iv + 7) = uVar2;
      *(ulong *)iv = CONCAT17(local_50,uStack_57);
      iv[0xf] = unaff_BL;
      sVar3 = sVar3 + 1;
    } while (length != sVar3);
  }
  return 0;
}

Assistant:

int mbedtls_aes_crypt_cfb8( mbedtls_aes_context *ctx,
                       int mode,
                       size_t length,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    unsigned char c;
    unsigned char ov[17];

    while( length-- )
    {
        memcpy( ov, iv, 16 );
        mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );

        if( mode == MBEDTLS_AES_DECRYPT )
            ov[16] = *input;

        c = *output++ = (unsigned char)( iv[0] ^ *input++ );

        if( mode == MBEDTLS_AES_ENCRYPT )
            ov[16] = c;

        memcpy( iv, ov + 1, 16 );
    }

    return( 0 );
}